

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O1

uint I_MakeRNGSeed(void)

{
  int __fd;
  time_t tVar1;
  uint seed;
  uint local_c;
  
  tVar1 = time((time_t *)0x0);
  local_c = (uint)tVar1;
  __fd = open("/dev/urandom",0);
  if (__fd < 0) {
    __fd = open("/dev/random",0);
  }
  if (-1 < __fd) {
    read(__fd,&local_c,4);
    close(__fd);
  }
  return local_c;
}

Assistant:

unsigned int I_MakeRNGSeed()
{
	unsigned int seed;
	int file;

	// Try reading from /dev/urandom first, then /dev/random, then
	// if all else fails, use a crappy seed from time().
	seed = time(NULL);
	file = open("/dev/urandom", O_RDONLY);
	if (file < 0)
	{
		file = open("/dev/random", O_RDONLY);
	}
	if (file >= 0)
	{
		read(file, &seed, sizeof(seed));
		close(file);
	}
	return seed;
}